

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

OBS_TYPE __thiscall
despot::Parser::GetObservation
          (Parser *this,vector<int,_std::allocator<int>_> *state,ACT_TYPE action,double *random)

{
  pointer piVar1;
  _func_int **pp_Var2;
  CPT *pCVar3;
  int iVar4;
  OBS_TYPE OVar5;
  long lVar6;
  pointer pNVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  
  piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar6 = (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    piVar9 = &(((this->curr_state_vars_).
                super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
    lVar10 = 0;
    do {
      *piVar9 = piVar1[lVar10];
      lVar10 = lVar10 + 1;
      piVar9 = piVar9 + 0x30;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar10);
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  pNVar7 = (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_finish == pNVar7) {
    OVar5 = 0;
  }
  else {
    lVar6 = 2;
    uVar11 = 0;
    OVar5 = 0;
    do {
      pp_Var2 = (&(pNVar7->super_Variable)._vptr_Variable)[lVar6];
      lVar10 = *(long *)((long)pNVar7 + lVar6 * 8 + -8);
      pCVar3 = (this->obs_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11];
      iVar4 = (*(pCVar3->super_Function)._vptr_Function[0xe])(pCVar3,random);
      OVar5 = (long)iVar4 + (long)(int)((ulong)((long)pp_Var2 - lVar10) >> 5) * OVar5;
      uVar11 = uVar11 + 1;
      pNVar7 = (this->obs_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pNVar7 >> 3) * -0x1111111111111111;
      lVar6 = lVar6 + 0xf;
    } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
  }
  return OVar5;
}

Assistant:

OBS_TYPE Parser::GetObservation(const vector<int>& state, ACT_TYPE action,
	double& random) const {
	for (int s = 0; s < state.size(); s++) {
		curr_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	OBS_TYPE obs = 0;
	for (int o = 0; o < obs_vars_.size(); o++) {
		obs = obs * obs_vars_[o].Size()
			+ obs_funcs_[o]->ComputeCurrentIndex(random);
	}
	return obs;
}